

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::ruby::GenerateEnumAssignment
          (ruby *this,string_view prefix,EnumDescriptor *en,Printer *printer)

{
  Printer *this_00;
  EnumDescriptor *pEVar1;
  string_view name;
  string_view local_98;
  string_view local_88 [2];
  string_view local_68;
  string local_58;
  string_view local_38;
  Printer *local_28;
  Printer *printer_local;
  EnumDescriptor *en_local;
  string_view prefix_local;
  
  printer_local = (Printer *)prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  pEVar1 = en;
  local_28 = (Printer *)en;
  en_local = (EnumDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"$prefix$$name$ = ");
  local_68 = EnumDescriptor::name((EnumDescriptor *)printer_local);
  name._M_str = (char *)pEVar1;
  name._M_len = (size_t)local_68._M_str;
  RubifyConstant_abi_cxx11_(&local_58,(ruby *)local_68._M_len,name);
  io::Printer::
  Print<char[7],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
            ((Printer *)en,local_38,(char (*) [7])0x9ff013,
             (basic_string_view<char,_std::char_traits<char>_> *)&en_local,(char (*) [5])0xc259cc,
             &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "::Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").enummodule\n"
            );
  local_98 = EnumDescriptor::full_name((EnumDescriptor *)printer_local);
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (this_00,local_88[0],(char (*) [10])0xb93fb9,&local_98);
  return;
}

Assistant:

void GenerateEnumAssignment(absl::string_view prefix, const EnumDescriptor* en,
                            io::Printer* printer) {
  printer->Print("$prefix$$name$ = ", "prefix", prefix, "name",
                 RubifyConstant(en->name()));
  printer->Print(
      "::Google::Protobuf::DescriptorPool.generated_pool."
      "lookup(\"$full_name$\").enummodule\n",
      "full_name", en->full_name());
}